

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

Matrix * MatrixIdentity(uint32_t n)

{
  undefined1 value [16];
  Matrix *a;
  uint32_t index;
  uint32_t rows;
  undefined6 in_stack_ffffffffffffffd2;
  
  if (n == 0) {
    a = (Matrix *)0x0;
    fprintf(_stderr,"%s: Invalid dimension (0x0 >= 1x1)\n","MatrixIdentity");
  }
  else {
    a = MatrixZero(n,n);
    for (rows = 0; n != rows; rows = rows + 1) {
      value._10_6_ = in_stack_ffffffffffffffd2;
      value._0_10_ = (longdouble)1;
      MatrixSetElement(a,rows,rows,(Real)value);
    }
  }
  return a;
}

Assistant:

Matrix *MatrixIdentity(uint32_t n) {
#ifndef NDEBUG
  if (n == 0) {
    fprintf(stderr, "%s: Invalid dimension (0x0 >= 1x1)\n", __FUNCTION_NAME__);
    return NULL;
  }
#endif
  Matrix *new = MatrixZero(n, n);
  /*
   * n=1 -> 0
   * n=2 -> 0,3
   * n=3 -> 0,4,8
   * n=4 -> 0,5,10,15
   * n=x -> 0,x+1,2*(x+1),3*(n+1),...
   */
  for (uint32_t index = 0; index < n; ++index) {
    MatrixSetElement(new, index, index, 1);
  }
  return new;
}